

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O1

void quantize_1(float *src,void *dst,int n,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float min;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 local_48 [32];
  uint64_t pp [4];
  
  if (0 < n) {
    iVar6 = k + 0x3f;
    if (-1 < k) {
      iVar6 = k;
    }
    uVar8 = 0;
    auVar1 = vpmovsxbd_avx(ZEXT416(0x8040201));
    uVar9 = 0;
    do {
      iVar7 = (int)uVar8;
      if (0x3f < k) {
        uVar4 = 0;
        do {
          pfVar5 = (float *)dst;
          lVar3 = 0;
          auVar12 = SUB6416(ZEXT464(0x7f7fffff),0);
          auVar11 = SUB6416(ZEXT464(0xff7fffff),0);
          do {
            auVar12 = vminss_avx(ZEXT416((uint)src[uVar8 + lVar3]),auVar12);
            auVar11 = vmaxss_avx(ZEXT416((uint)src[uVar8 + lVar3]),auVar11);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x40);
          fVar13 = auVar12._0_4_;
          fVar14 = (auVar11._0_4_ - fVar13) / 15.0;
          auVar11 = vcmpss_avx(ZEXT416((uint)fVar14),ZEXT816(0) << 0x40,4);
          auVar11 = vandps_avx(auVar11,ZEXT416((uint)(1.0 / fVar14)));
          *pfVar5 = fVar13;
          pfVar5[1] = fVar14;
          local_48 = ZEXT1632(ZEXT816(0));
          lVar3 = 0;
          do {
            lVar10 = 1L << ((byte)lVar3 & 0x3f);
            auVar12[0] = (undefined1)(int)(auVar11._0_4_ * (src[uVar8 + lVar3] - fVar13));
            auVar12[1] = auVar12[0];
            auVar12[2] = auVar12[0];
            auVar12[3] = auVar12[0];
            auVar12[4] = auVar12[0];
            auVar12[5] = auVar12[0];
            auVar12[6] = auVar12[0];
            auVar12[7] = auVar12[0];
            auVar12[8] = auVar12[0];
            auVar12[9] = auVar12[0];
            auVar12[10] = auVar12[0];
            auVar12[0xb] = auVar12[0];
            auVar12[0xc] = auVar12[0];
            auVar12[0xd] = auVar12[0];
            auVar12[0xe] = auVar12[0];
            auVar12[0xf] = auVar12[0];
            auVar12 = vpand_avx(auVar12,auVar1);
            auVar12 = vpcmpeqd_avx(auVar12,(undefined1  [16])0x0);
            auVar15._8_8_ = lVar10;
            auVar15._0_8_ = lVar10;
            auVar15._16_8_ = lVar10;
            auVar15._24_8_ = lVar10;
            auVar2 = vpmovsxdq_avx2(auVar12);
            auVar2 = vpandn_avx2(auVar2,auVar15);
            local_48 = vpor_avx2(local_48,auVar2);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x40);
          lVar3 = 0;
          do {
            *(undefined8 *)((long)pfVar5 + lVar3 + 8) = *(undefined8 *)(local_48 + lVar3);
            lVar3 = lVar3 + 8;
          } while (lVar3 != 0x20);
          uVar4 = uVar4 + 1;
          uVar8 = (ulong)((int)uVar8 + 0x40);
          dst = pfVar5 + 10;
        } while (uVar4 != (uint)(iVar6 >> 6));
        dst = pfVar5 + 10;
      }
      uVar9 = uVar9 + 1;
      uVar8 = (ulong)(uint)(iVar7 + k);
    } while (uVar9 != (uint)n);
  }
  return;
}

Assistant:

void quantize_1(const float * src, void * dst, int n, int k) {
    char * p0 = dst;

    gq_quant_t pp[QB];

    for (int j = 0; j < n; j++) {
        for (int i = 0; i < k/QK; i++) {
            float min = FLT_MAX;
            float max = -FLT_MAX;

            // find min/max
#ifdef __ARM_NEON
            {
                float32x4_t minv = vdupq_n_f32(FLT_MAX);
                float32x4_t maxv = vdupq_n_f32(-FLT_MAX);

                for (int l = 0; l < QK; l += 4) {
                    float32x4_t v = vld1q_f32(src + j*k + i*QK + l);
                    minv = vminq_f32(minv, v);
                    maxv = vmaxq_f32(maxv, v);
                }

                float32x2_t minv32 = vpmin_f32(vget_low_f32(minv), vget_high_f32(minv));
                float32x2_t maxv32 = vpmax_f32(vget_low_f32(maxv), vget_high_f32(maxv));

                min = MIN(vget_lane_f32(minv32, 0), vget_lane_f32(minv32, 1));
                max = MAX(vget_lane_f32(maxv32, 0), vget_lane_f32(maxv32, 1));

                //printf("SIMD min/max: %f %f\n", min, max);
            }
#else
            {
                for (int l = 0; l < QK; l++) {
                    const float v = src[j*k + i*QK + l];
                    if (v < min) min = v;
                    if (v > max) max = v;
                }

                //printf("NORM min/max: %f %f\n", min, max);
            }
#endif

            const float d = (max - min) / ((1 << QB) - 1);
            const float id = d ? 1.0/d : 0.0;

            memcpy(p0, &min, sizeof(float)); p0 += sizeof(float);
            memcpy(p0, &d,   sizeof(float)); p0 += sizeof(float);

            //printf("min/max/d/id: %f %f %f %f\n", min, max, d, id);

            for (int s = 0; s < QK/gq_t_bits; ++s) {
                memset(pp, 0, sizeof(pp));

                for (int l = 0; l < gq_t_bits; l++) {
                    const   float v = src[j*k + i*QK + s*gq_t_bits + l];
                    const uint8_t q = (v - min)*id;

                    for (int b = 0; b < QB; b++) {
                        pp[b] |= q & (1 << b) ? (1ULL << l) : 0;
                    }
                }

                for (int b = 0; b < QB; b++) {
                    memcpy(p0, &pp[b], sizeof(gq_quant_t)); p0 += sizeof(gq_quant_t);
                }
            }
        }
    }
}